

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::completionCommon(QPDFArgParser *this,bool zsh)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  char *__s1;
  ostream *poVar7;
  long lVar8;
  bool local_18a;
  size_t slash;
  string path;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string appimage;
  string appdir;
  string executable;
  allocator<char> local_39;
  string local_38 [8];
  string progname;
  bool zsh_local;
  QPDFArgParser *this_local;
  
  progname.field_2._M_local_buf[0xf] = zsh;
  peVar3 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pcVar4 = *peVar3->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar4,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)(appdir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(appimage.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b0);
  std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar4,&local_d1);
  bVar1 = QUtil::get_env(&local_d0,(string *)((long)&appdir.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if (bVar1) {
    std::__cxx11::string::operator=(local_38,(string *)(appdir.field_2._M_local_buf + 8));
  }
  else {
    std::allocator<char>::allocator();
    path.field_2._M_local_buf[0xe] = '\0';
    path.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"APPDIR",&local_f9);
    bVar1 = QUtil::get_env(&local_f8,(string *)((long)&appimage.field_2 + 8));
    local_18a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      path.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"APPIMAGE",
                 (allocator<char> *)(path.field_2._M_local_buf + 0xf));
      path.field_2._M_local_buf[0xd] = '\x01';
      local_18a = QUtil::get_env(&local_120,(string *)local_b0);
    }
    if ((path.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_120);
    }
    if ((path.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    if (local_18a != false) {
      uVar5 = std::__cxx11::string::length();
      peVar3 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      sVar6 = strlen(*peVar3->argv);
      if (uVar5 < sVar6) {
        __s1 = (char *)std::__cxx11::string::c_str();
        peVar3 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pcVar4 = *peVar3->argv;
        sVar6 = std::__cxx11::string::length();
        iVar2 = strncmp(__s1,pcVar4,sVar6);
        if (iVar2 == 0) {
          std::__cxx11::string::operator=(local_38,(string *)local_b0);
        }
      }
    }
  }
  if ((progname.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"autoload -U +X bashcompinit && bashcompinit && ");
  }
  std::operator<<((ostream *)&std::cout,"complete -o bashdefault -o default");
  if ((progname.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator<<((ostream *)&std::cout," -o nospace");
  }
  poVar7 = std::operator<<((ostream *)&std::cout," -C \"");
  poVar7 = std::operator<<(poVar7,local_38);
  poVar7 = std::operator<<(poVar7,"\" ");
  peVar3 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  poVar7 = std::operator<<(poVar7,(string *)&peVar3->whoami);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)&slash,local_38);
  lVar8 = std::__cxx11::string::find((char)&slash,0x2f);
  if ((lVar8 != 0) && (lVar8 != -1)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    peVar3 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    poVar7 = std::operator<<(poVar7,(string *)&peVar3->whoami);
    poVar7 = std::operator<<(poVar7," completion enabled");
    poVar7 = std::operator<<(poVar7," using relative path to executable");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&slash);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(appimage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(appdir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
QPDFArgParser::completionCommon(bool zsh)
{
    std::string progname = m->argv[0];
    std::string executable;
    std::string appdir;
    std::string appimage;
    if (QUtil::get_env(m->progname_env.c_str(), &executable)) {
        progname = executable;
    } else if (QUtil::get_env("APPDIR", &appdir) && QUtil::get_env("APPIMAGE", &appimage)) {
        // Detect if we're in an AppImage and adjust
        if ((appdir.length() < strlen(m->argv[0])) &&
            (strncmp(appdir.c_str(), m->argv[0], appdir.length()) == 0)) {
            progname = appimage;
        }
    }
    if (zsh) {
        std::cout << "autoload -U +X bashcompinit && bashcompinit && ";
    }
    std::cout << "complete -o bashdefault -o default";
    if (!zsh) {
        std::cout << " -o nospace";
    }
    std::cout << " -C \"" << progname << "\" " << m->whoami << std::endl;
    // Put output before error so calling from zsh works properly
    std::string path = progname;
    size_t slash = path.find('/');
    if ((slash != 0) && (slash != std::string::npos)) {
        std::cerr << "WARNING: " << m->whoami << " completion enabled"
                  << " using relative path to executable" << std::endl;
    }
}